

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directize.cpp
# Opt level: O0

IndirectCallInfo * __thiscall
wasm::anon_unknown_157::FunctionDirectizer::getTargetInfo
          (IndirectCallInfo *__return_storage_ptr__,FunctionDirectizer *this,Expression *target,
          TableInfo *table,CallIndirect *original)

{
  Name name_00;
  bool bVar1;
  Const *pCVar2;
  uint64_t a;
  type this_00;
  address64_t aVar3;
  size_type sVar4;
  reference pvVar5;
  Module *this_01;
  Known local_98;
  Trap local_81;
  size_t local_80;
  size_t local_78;
  Function *local_70;
  Function *func;
  undefined1 local_60 [8];
  value_type name;
  FlatTable *flatTable;
  Address index;
  Const *c;
  CallIndirect *original_local;
  TableInfo *table_local;
  Expression *target_local;
  FunctionDirectizer *this_local;
  
  pCVar2 = Expression::dynCast<wasm::Const>(target);
  if (pCVar2 == (Const *)0x0) {
    std::variant<wasm::CallUtils::Unknown,wasm::CallUtils::Trap,wasm::CallUtils::Known>::
    variant<wasm::CallUtils::Unknown,void,void,wasm::CallUtils::Unknown,void>
              ((variant<wasm::CallUtils::Unknown,wasm::CallUtils::Trap,wasm::CallUtils::Known> *)
               __return_storage_ptr__,(Unknown *)((long)&index.addr + 7));
  }
  else {
    a = wasm::Literal::getUnsigned(&pCVar2->value);
    wasm::Address::Address((Address *)&flatTable,a);
    this_00 = std::
              unique_ptr<wasm::TableUtils::FlatTable,_std::default_delete<wasm::TableUtils::FlatTable>_>
              ::operator*(&table->flatTable);
    aVar3 = wasm::Address::operator_cast_to_unsigned_long((Address *)&flatTable);
    sVar4 = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::size(&this_00->names);
    if (aVar3 < sVar4) {
      aVar3 = wasm::Address::operator_cast_to_unsigned_long((Address *)&flatTable);
      pvVar5 = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::operator[]
                         (&this_00->names,aVar3);
      local_60 = (undefined1  [8])(pvVar5->super_IString).str._M_len;
      name.super_IString.str._M_len = (size_t)(pvVar5->super_IString).str._M_str;
      bVar1 = IString::is((IString *)local_60);
      if (bVar1) {
        this_01 = Walker<wasm::(anonymous_namespace)::FunctionDirectizer,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionDirectizer,_void>_>
                  ::getModule(&(this->
                               super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionDirectizer,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionDirectizer,_void>_>_>
                               ).
                               super_PostWalker<wasm::(anonymous_namespace)::FunctionDirectizer,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionDirectizer,_void>_>
                               .
                               super_Walker<wasm::(anonymous_namespace)::FunctionDirectizer,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionDirectizer,_void>_>
                             );
        local_80 = (size_t)local_60;
        local_78 = name.super_IString.str._M_len;
        name_00.super_IString.str._M_str = (char *)name.super_IString.str._M_len;
        name_00.super_IString.str._M_len = (size_t)local_60;
        local_70 = Module::getFunction(this_01,name_00);
        bVar1 = HeapType::operator!=(&original->heapType,&local_70->type);
        if (bVar1) {
          std::variant<wasm::CallUtils::Unknown,wasm::CallUtils::Trap,wasm::CallUtils::Known>::
          variant<wasm::CallUtils::Trap,void,void,wasm::CallUtils::Trap,void>
                    ((variant<wasm::CallUtils::Unknown,wasm::CallUtils::Trap,wasm::CallUtils::Known>
                      *)__return_storage_ptr__,&local_81);
        }
        else {
          local_98.target.super_IString.str._M_len = (size_t)local_60;
          local_98.target.super_IString.str._M_str = (char *)name.super_IString.str._M_len;
          std::variant<wasm::CallUtils::Unknown,wasm::CallUtils::Trap,wasm::CallUtils::Known>::
          variant<wasm::CallUtils::Known,void,void,wasm::CallUtils::Known,void>
                    ((variant<wasm::CallUtils::Unknown,wasm::CallUtils::Trap,wasm::CallUtils::Known>
                      *)__return_storage_ptr__,&local_98);
        }
      }
      else {
        std::variant<wasm::CallUtils::Unknown,wasm::CallUtils::Trap,wasm::CallUtils::Known>::
        variant<wasm::CallUtils::Trap,void,void,wasm::CallUtils::Trap,void>
                  ((variant<wasm::CallUtils::Unknown,wasm::CallUtils::Trap,wasm::CallUtils::Known> *
                   )__return_storage_ptr__,(Trap *)((long)&func + 7));
      }
    }
    else if ((table->mayBeModified & 1U) == 0) {
      std::variant<wasm::CallUtils::Unknown,wasm::CallUtils::Trap,wasm::CallUtils::Known>::
      variant<wasm::CallUtils::Trap,void,void,wasm::CallUtils::Trap,void>
                ((variant<wasm::CallUtils::Unknown,wasm::CallUtils::Trap,wasm::CallUtils::Known> *)
                 __return_storage_ptr__,(Trap *)((long)&name.super_IString.str._M_str + 7));
    }
    else {
      if ((table->initialContentsImmutable & 1U) == 0) {
        __assert_fail("table.initialContentsImmutable",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Directize.cpp"
                      ,0x93,
                      "CallUtils::IndirectCallInfo wasm::(anonymous namespace)::FunctionDirectizer::getTargetInfo(Expression *, const TableInfo &, CallIndirect *)"
                     );
      }
      std::variant<wasm::CallUtils::Unknown,wasm::CallUtils::Trap,wasm::CallUtils::Known>::
      variant<wasm::CallUtils::Unknown,void,void,wasm::CallUtils::Unknown,void>
                ((variant<wasm::CallUtils::Unknown,wasm::CallUtils::Trap,wasm::CallUtils::Known> *)
                 __return_storage_ptr__,(Unknown *)((long)&name.super_IString.str._M_str + 6));
    }
  }
  return __return_storage_ptr__;
}

Assistant:

CallUtils::IndirectCallInfo getTargetInfo(Expression* target,
                                            const TableInfo& table,
                                            CallIndirect* original) {
    auto* c = target->dynCast<Const>();
    if (!c) {
      return CallUtils::Unknown{};
    }

    Address index = c->value.getUnsigned();

    // Check if index is invalid, or the type is wrong.
    auto& flatTable = *table.flatTable;
    if (index >= flatTable.names.size()) {
      // The index is out of bounds for the initial table's content. This may
      // trap, but it may also not trap if the table is modified later (if a
      // function is appended to it).
      if (!table.mayBeModified) {
        return CallUtils::Trap{};
      } else {
        // The table may be modified, so it might be appended to. We should only
        // get here in the case that the initial contents are immutable, as
        // otherwise we have nothing to optimize at all.
        assert(table.initialContentsImmutable);
        return CallUtils::Unknown{};
      }
    }
    auto name = flatTable.names[index];
    if (!name.is()) {
      return CallUtils::Trap{};
    }
    auto* func = getModule()->getFunction(name);
    if (original->heapType != func->type) {
      return CallUtils::Trap{};
    }
    return CallUtils::Known{name};
  }